

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int noentParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char *r1;
  uint uVar4;
  
  nb_tests = nb_tests + 1;
  lVar3 = xmlReadFile(filename,0,options);
  uVar4 = 1;
  if (lVar3 != 0) {
    r1 = resultFilename(filename,temp_directory,".res");
    if (r1 == (char *)0x0) {
      fwrite("Out of memory\n",0xe,1,_stderr);
      fatalError();
    }
    xmlSaveFile(r1,lVar3);
    iVar1 = compareFiles(r1,result);
    xmlFreeDoc(lVar3);
    lVar3 = xmlReadFile(filename,0,options);
    if (lVar3 != 0) {
      xmlSaveFile(r1,lVar3);
      iVar2 = compareFiles(r1,result);
      uVar4 = (uint)(iVar2 != 0 || iVar1 != 0);
      xmlFreeDoc(lVar3);
      unlink(r1);
      free(r1);
    }
  }
  return uVar4;
}

Assistant:

static int
noentParseTest(const char *filename, const char *result,
               const char *err  ATTRIBUTE_UNUSED,
	       int options) {
    xmlDocPtr doc;
    char *temp;
    int res = 0;

    nb_tests++;
    /*
     * base of the test, parse with the old API
     */
    doc = xmlReadFile(filename, NULL, options);
    if (doc == NULL)
        return(1);
    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    xmlSaveFile(temp, doc);
    if (compareFiles(temp, result)) {
        res = 1;
    }
    xmlFreeDoc(doc);

    /*
     * Parse the saved result to make sure the round trip is okay
     */
    doc = xmlReadFile(filename, NULL, options);
    if (doc == NULL)
        return(1);
    xmlSaveFile(temp, doc);
    if (compareFiles(temp, result)) {
        res = 1;
    }
    xmlFreeDoc(doc);

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }
    return(res);
}